

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O3

void pd_tilde_dsp(t_pd_tilde *x,t_signal **sp)

{
  int iVar1;
  t_sample **pptVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = x->x_ninsig;
  if (iVar1 == 0) {
    if (x->x_noutsig == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = (*sp)->s_n;
    }
    x->x_blksize = iVar3;
  }
  else {
    x->x_blksize = (*sp)->s_n;
    if (0 < iVar1) {
      pptVar2 = x->x_insig;
      lVar4 = 0;
      lVar5 = 0;
      do {
        pptVar2[lVar5] = sp[lVar5]->s_vec;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + -8;
      } while (iVar1 != (int)lVar5);
      sp = (t_signal **)((long)sp - lVar4);
    }
  }
  iVar3 = x->x_noutsig;
  if (0 < iVar3) {
    pptVar2 = x->x_outsig;
    lVar4 = 0;
    do {
      pptVar2[lVar4] = sp[(ulong)(iVar1 == 0) + lVar4]->s_vec;
      lVar4 = lVar4 + 1;
    } while (iVar3 != (int)lVar4);
  }
  dsp_add(pd_tilde_perform,1);
  return;
}

Assistant:

static void pd_tilde_dsp(t_pd_tilde *x, t_signal **sp)
{
    int i;
    t_pdsample **g;

    x->x_blksize = (x->x_ninsig || x->x_noutsig ? sp[0]->s_n : 1);
    for (i = 0, g = x->x_insig; i < x->x_ninsig; i++, g++)
        *g = (*(sp++))->s_vec;
        /* if there were no input signals Pd still provided us with one,
        which we ignore: */
    if (!x->x_ninsig)
        sp++;
    for (i = 0, g = x->x_outsig; i < x->x_noutsig; i++, g++)
        *g = (*(sp++))->s_vec;
    dsp_add(pd_tilde_perform, 1, x);
}